

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O0

void __thiscall
gvr::Mesh::Mesh(Mesh *this,Mesh *p,vector<bool,_std::allocator<bool>_> *vused,
               vector<bool,_std::allocator<bool>_> *tused)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  const_reference cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  _func_int **pp_Var9;
  reference pvVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<bool,_std::allocator<bool>_> *in_RCX;
  PointCloud *in_RDX;
  Mesh *in_RSI;
  PointCloud *in_RDI;
  float fVar11;
  int i_3;
  int i_2;
  int i_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> index;
  int i;
  uint k;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  int local_5c;
  int local_58;
  int local_54;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  int local_34;
  uint local_30;
  
  PointCloud::PointCloud(&in_RSI->super_PointCloud,in_RDX,in_RCX);
  (in_RDI->super_Model)._vptr_Model = (_func_int **)&PTR__Mesh_001f9190;
  iVar4 = PointCloud::getVertexCount(in_RDI);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(iVar4 * 3);
  uVar8 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pp_Var9 = (_func_int **)operator_new__(uVar8);
  in_RDI[1].super_Model._vptr_Model = pp_Var9;
  local_30 = 0;
  for (local_34 = 0; iVar4 = local_34, iVar5 = PointCloud::getVertexCount(&in_RSI->super_PointCloud)
      , iVar4 < iVar5; local_34 = local_34 + 1) {
    cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (cVar3) {
      fVar11 = getNormalComp(in_RSI,local_34,0);
      uVar8 = (ulong)local_30;
      local_30 = local_30 + 1;
      *(float *)((long)in_RDI[1].super_Model._vptr_Model + uVar8 * 4) = fVar11;
      fVar11 = getNormalComp(in_RSI,local_34,1);
      uVar8 = (ulong)local_30;
      local_30 = local_30 + 1;
      *(float *)((long)in_RDI[1].super_Model._vptr_Model + uVar8 * 4) = fVar11;
      fVar11 = getNormalComp(in_RSI,local_34,2);
      *(float *)((long)in_RDI[1].super_Model._vptr_Model + (ulong)local_30 * 4) = fVar11;
      local_30 = local_30 + 1;
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x161b3c);
  PointCloud::getVertexCount(&in_RSI->super_PointCloud);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  local_30 = 0;
  for (local_54 = 0; iVar4 = PointCloud::getVertexCount(&in_RSI->super_PointCloud), local_54 < iVar4
      ; local_54 = local_54 + 1) {
    cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (cVar3) {
      in_stack_ffffffffffffff64 = local_30;
      local_30 = local_30 + 1;
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&local_50,(long)local_54);
      *pvVar10 = in_stack_ffffffffffffff64;
    }
  }
  in_RDI[1].super_Model.id = 0;
  local_58 = 0;
  while (iVar4 = local_58, iVar5 = getTriangleCount(in_RSI), iVar4 < iVar5) {
    cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT44(in_stack_ffffffffffffff64,iVar5),
                       CONCAT44(iVar4,in_stack_ffffffffffffff58));
    in_stack_ffffffffffffff58 = CONCAT13(cVar3,(int3)in_stack_ffffffffffffff58);
    if (cVar3) {
      in_RDI[1].super_Model.id = in_RDI[1].super_Model.id + 1;
    }
    local_58 = local_58 + 1;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(in_RDI[1].super_Model.id * 3);
  uVar8 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new__(uVar8);
  in_RDI[1].super_Model.origin.v[0] = (double)this_00;
  local_30 = 0;
  for (local_5c = 0; iVar6 = getTriangleCount(in_RSI), local_5c < iVar6; local_5c = local_5c + 1) {
    cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT44(in_stack_ffffffffffffff64,iVar5),
                       CONCAT44(iVar4,in_stack_ffffffffffffff58));
    if (cVar3) {
      uVar7 = getTriangleIndex(in_RSI,local_5c,0);
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&local_50,(ulong)uVar7);
      uVar8 = (ulong)local_30;
      local_30 = local_30 + 1;
      *(value_type *)((long)in_RDI[1].super_Model.origin.v[0] + uVar8 * 4) = *pvVar10;
      uVar7 = getTriangleIndex(in_RSI,local_5c,1);
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&local_50,(ulong)uVar7);
      uVar8 = (ulong)local_30;
      local_30 = local_30 + 1;
      *(value_type *)((long)in_RDI[1].super_Model.origin.v[0] + uVar8 * 4) = *pvVar10;
      uVar7 = getTriangleIndex(in_RSI,local_5c,2);
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&local_50,(ulong)uVar7);
      *(value_type *)((long)in_RDI[1].super_Model.origin.v[0] + (ulong)local_30 * 4) = *pvVar10;
      local_30 = local_30 + 1;
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this_00);
  return;
}

Assistant:

Mesh::Mesh(const Mesh &p, const std::vector<bool> &vused, const std::vector<bool> &tused)
  : PointCloud(p, vused)
{
  normal=new float [3*getVertexCount()];

  unsigned int k=0;

  for (int i=0; i<p.getVertexCount(); i++)
  {
    if (vused[i])
    {
      normal[k++]=p.getNormalComp(i, 0);
      normal[k++]=p.getNormalComp(i, 1);
      normal[k++]=p.getNormalComp(i, 2);
    }
  }

  // adapt indices of triangle vertices

  std::vector<unsigned int> index;
  index.resize(p.getVertexCount());

  k=0;

  for (int i=0; i<p.getVertexCount(); i++)
  {
    if (vused[i])
    {
      index[i]=k++;
    }
  }

  n=0;

  for (int i=0; i<p.getTriangleCount(); i++)
    if (tused[i])
    {
      n++;
    }

  triangle=new unsigned int [3*n];

  k=0;

  for (int i=0; i<p.getTriangleCount(); i++)
  {
    if (tused[i])
    {
      triangle[k++]=index[p.getTriangleIndex(i, 0)];
      triangle[k++]=index[p.getTriangleIndex(i, 1)];
      triangle[k++]=index[p.getTriangleIndex(i, 2)];
    }
  }
}